

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O2

bool __thiscall
tinyusdz::tydra::RenderSceneConverter::ConvertMaterial
          (RenderSceneConverter *this,RenderSceneConverterEnv *env,Path *mat_abs_path,
          Material *material,RenderMaterial *rmat_out)

{
  Stage *this_00;
  RenderSceneConverter *pRVar1;
  bool bVar2;
  Shader *pSVar3;
  UsdPreviewSurface *shader;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  string *err_00;
  string *in;
  RenderMaterial *args_1;
  long lVar5;
  Prim *shaderPrim;
  string err;
  Path surfacePath;
  ostringstream ss_e;
  RenderMaterial rmat;
  allocator local_4a1;
  RenderSceneConverter *local_4a0;
  RenderSceneConverterEnv *local_498;
  string local_490;
  RenderMaterial *local_470;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_468;
  string local_450;
  PreviewSurfaceShader local_430;
  string local_398;
  Path local_378;
  Path local_2a8;
  undefined1 local_130 [96];
  undefined1 local_d0 [160];
  
  if (rmat_out == (RenderMaterial *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2a8);
    poVar4 = ::std::operator<<((ostream *)&local_2a8,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ConvertMaterial");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x1389);
    ::std::operator<<(poVar4," ");
    poVar4 = ::std::operator<<((ostream *)&local_2a8,"rmat_out argument is nullptr.");
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)&this->_err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2a8);
    return false;
  }
  args_1 = rmat_out;
  RenderMaterial::RenderMaterial((RenderMaterial *)local_130);
  ::std::__cxx11::string::_M_assign((string *)(local_130 + 0x20));
  Path::element_name_abi_cxx11_(mat_abs_path);
  ::std::__cxx11::string::_M_assign((string *)local_130);
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  local_398._M_string_length = 0;
  local_378._prim_part._M_dataplus._M_p = (pointer)&local_378._prim_part.field_2;
  local_378._prim_part._M_string_length = 0;
  local_378._prim_part.field_2._M_local_buf[0] = '\0';
  local_378._prop_part._M_dataplus._M_p = (pointer)&local_378._prop_part.field_2;
  local_378._prop_part._M_string_length = 0;
  local_378._prop_part.field_2._M_local_buf[0] = '\0';
  local_378._variant_part._M_dataplus._M_p = (pointer)&local_378._variant_part.field_2;
  local_378._variant_part._M_string_length = 0;
  local_378._variant_part.field_2._M_local_buf[0] = '\0';
  local_378._variant_selection_part._M_dataplus._M_p =
       (pointer)&local_378._variant_selection_part.field_2;
  local_378._variant_selection_part._M_string_length = 0;
  local_378._variant_selection_part.field_2._M_local_buf[0] = '\0';
  local_378._variant_part_str._M_dataplus._M_p = (pointer)&local_378._variant_part_str.field_2;
  local_378._variant_part_str._M_string_length = 0;
  local_378._variant_part_str.field_2._M_local_buf[0] = '\0';
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &local_378._element.field_2;
  local_378._element._M_string_length = 0;
  local_378._element.field_2._M_local_buf[0] = '\0';
  local_378._path_type.has_value_ = false;
  local_378._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
  local_398.field_2._M_local_buf[0] = '\0';
  local_378._valid = false;
  local_378._element._M_dataplus._M_p = (pointer)args;
  if ((material->surface)._authored != true) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2a8);
    poVar4 = ::std::operator<<((ostream *)&local_2a8,"[warn]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ConvertMaterial");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x13a7);
    ::std::operator<<(poVar4," ");
    ::std::__cxx11::string::string
              ((string *)&local_490,
               "{}\'s outputs:surface isn\'t authored, so not a valid Material/Shader. Create a default Material\n"
               ,(allocator *)&local_468);
    Path::full_path_name_abi_cxx11_(&local_450,mat_abs_path);
    fmt::format<std::__cxx11::string>
              ((string *)&local_430,(fmt *)&local_490,(string *)&local_450,args);
    poVar4 = ::std::operator<<((ostream *)&local_2a8,(string *)&local_430);
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)&this->_warn);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2a8);
LAB_0029ceeb:
    RenderMaterial::operator=(rmat_out,(RenderMaterial *)local_130);
    bVar2 = true;
    goto LAB_0029d546;
  }
  local_498 = env;
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            (&local_468,
             (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&material->surface);
  lVar5 = (long)local_468.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_468.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_4a0 = this;
  if (lVar5 == 0xd0) {
    Path::operator=(&local_378,
                    local_468.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2a8);
    poVar4 = ::std::operator<<((ostream *)&local_2a8,"[error]");
    poVar4 = ::std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                              );
    poVar4 = ::std::operator<<(poVar4,":");
    poVar4 = ::std::operator<<(poVar4,"ConvertMaterial");
    poVar4 = ::std::operator<<(poVar4,"():");
    poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x139f);
    ::std::operator<<(poVar4," ");
    ::std::__cxx11::string::string
              ((string *)&local_490,
               "{}\'s outputs:surface must be connection with single target Path.\n",&local_4a1);
    Path::full_path_name_abi_cxx11_(&local_450,mat_abs_path);
    local_470 = rmat_out;
    fmt::format<std::__cxx11::string>
              ((string *)&local_430,(fmt *)&local_490,(string *)&local_450,args);
    poVar4 = ::std::operator<<((ostream *)&local_2a8,(string *)&local_430);
    ::std::operator<<(poVar4,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::stringbuf::str();
    rmat_out = local_470;
    ::std::__cxx11::string::append((string *)&this->_err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2a8);
  }
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_468);
  if (lVar5 == 0xd0) {
    local_468.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    this_00 = local_498->stage;
    ::std::__cxx11::string::string((string *)&local_430,"",(allocator *)&local_490);
    Path::Path(&local_2a8,(string *)&local_378,(string *)&local_430);
    err_00 = &local_398;
    bVar2 = Stage::find_prim_at_path(this_00,&local_2a8,(Prim **)&local_468,err_00);
    Path::~Path(&local_2a8);
    ::std::__cxx11::string::_M_dispose();
    if (bVar2) {
      if ((Prim *)local_468.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                  _M_impl.super__Vector_impl_data._M_start == (Prim *)0x0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2a8);
        poVar4 = ::std::operator<<((ostream *)&local_2a8,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ConvertMaterial");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x13bd);
        ::std::operator<<(poVar4," ");
        poVar4 = ::std::operator<<((ostream *)&local_2a8,"[InternalError] invalid Shader Prim.\n");
        ::std::operator<<(poVar4,"\n");
LAB_0029d50b:
        ::std::__cxx11::stringbuf::str();
        pRVar1 = local_4a0;
      }
      else {
        pSVar3 = Prim::as<tinyusdz::Shader>
                           ((Prim *)local_468.
                                    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
        if (pSVar3 == (Shader *)0x0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2a8);
          poVar4 = ::std::operator<<((ostream *)&local_2a8,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ConvertMaterial");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x13c6);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_490,
                     "{}\'s outputs:surface must be connected to Shader Prim, but connected to `{}` Prim.\n"
                     ,(allocator *)&local_450);
          in = (string *)
               ((long)local_468.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                      _M_impl.super__Vector_impl_data._M_start + 0x270);
LAB_0029d4dc:
          fmt::format<std::__cxx11::string>
                    ((string *)&local_430,(fmt *)&local_490,in,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err_00);
          poVar4 = ::std::operator<<((ostream *)&local_2a8,(string *)&local_430);
          ::std::operator<<(poVar4,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          goto LAB_0029d50b;
        }
        shader = tinyusdz::value::Value::as<tinyusdz::UsdPreviewSurface>(&pSVar3->value,false);
        if (shader == (UsdPreviewSurface *)0x0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2a8);
          poVar4 = ::std::operator<<((ostream *)&local_2a8,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ConvertMaterial");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x13ce);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_490,"Shader\'s info:id must be UsdPreviewSurface, but got {}",
                     (allocator *)&local_450);
          in = (string *)&pSVar3->info_id;
          goto LAB_0029d4dc;
        }
        bVar2 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_378._prop_part,"outputs:surface");
        pRVar1 = local_4a0;
        if (bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2a8);
          poVar4 = ::std::operator<<((ostream *)&local_2a8,"[error]");
          poVar4 = ::std::operator<<(poVar4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                    );
          poVar4 = ::std::operator<<(poVar4,":");
          poVar4 = ::std::operator<<(poVar4,"ConvertMaterial");
          poVar4 = ::std::operator<<(poVar4,"():");
          poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x13d6);
          ::std::operator<<(poVar4," ");
          ::std::__cxx11::string::string
                    ((string *)&local_490,
                     "{}\'s outputs:surface connection must point to property `outputs:surface`, but got `{}`"
                     ,&local_4a1);
          Path::full_path_name_abi_cxx11_(&local_450,mat_abs_path);
          fmt::format<std::__cxx11::string,std::__cxx11::string>
                    ((string *)&local_430,(fmt *)&local_490,&local_450,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_378._prop_part,&args_1->name);
          goto LAB_0029d288;
        }
        local_430.useSpecularWorkflow = false;
        local_430.diffuseColor.value._M_elems[0] = 0.18;
        local_430.diffuseColor.value._M_elems[1] = 0.18;
        local_430.diffuseColor.value._M_elems[2] = 0.18;
        local_430.diffuseColor.texture_id = -1;
        local_430.emissiveColor.value._M_elems[0] = 0.0;
        local_430.emissiveColor.value._M_elems[1] = 0.0;
        local_430.emissiveColor.value._M_elems[2] = 0.0;
        local_430.emissiveColor.texture_id = -1;
        local_430.specularColor.value._M_elems[0] = 0.0;
        local_430.specularColor.value._M_elems[1] = 0.0;
        local_430.specularColor.value._M_elems[2] = 0.0;
        local_430.specularColor.texture_id = -1;
        local_430.metallic.value = 0.0;
        local_430.metallic.texture_id = -1;
        local_430.roughness.value = 0.5;
        local_430.roughness.texture_id = -1;
        local_430.clearcoat.value = 0.0;
        local_430.clearcoat.texture_id = -1;
        local_430.clearcoatRoughness.value = 0.01;
        local_430.clearcoatRoughness.texture_id = -1;
        local_430.opacity.value = 1.0;
        local_430.opacity.texture_id = -1;
        local_430.opacityThreshold.value = 0.0;
        local_430.opacityThreshold.texture_id = -1;
        local_430.ior.value = 1.5;
        local_430.ior.texture_id = -1;
        local_430.normal.value._M_elems[0] = 0.0;
        local_430.normal.value._M_elems[1] = 0.0;
        local_430.normal.value._M_elems[2] = 1.0;
        local_430.normal.texture_id = -1;
        local_430.displacement.value = 0.0;
        local_430.displacement.texture_id = -1;
        local_430.occlusion.value = 0.0;
        local_430.occlusion.texture_id = -1;
        local_430.handle = 0;
        bVar2 = ConvertPreviewSurfaceShader(local_4a0,local_498,&local_378,shader,&local_430);
        if (bVar2) {
          memcpy(local_d0,&local_430,0x98);
          goto LAB_0029ceeb;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2a8);
        poVar4 = ::std::operator<<((ostream *)&local_2a8,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ConvertMaterial");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x13dc);
        ::std::operator<<(poVar4," ");
        ::std::__cxx11::string::string
                  ((string *)&local_450,"Failed to convert UsdPreviewSurface : {}",&local_4a1);
        fmt::format<std::__cxx11::string>
                  (&local_490,(fmt *)&local_450,&local_378._prim_part,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)shader);
        poVar4 = ::std::operator<<((ostream *)&local_2a8,(string *)&local_490);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
      }
      ::std::__cxx11::string::append((string *)&pRVar1->_err);
      ::std::__cxx11::string::_M_dispose();
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2a8);
      poVar4 = ::std::operator<<((ostream *)&local_2a8,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"ConvertMaterial");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x13b8);
      ::std::operator<<(poVar4," ");
      ::std::__cxx11::string::string
                ((string *)&local_490,
                 "{}\'s outputs:surface isn\'t connected to exising Prim path.\n",&local_4a1);
      Path::full_path_name_abi_cxx11_(&local_450,mat_abs_path);
      fmt::format<std::__cxx11::string>
                ((string *)&local_430,(fmt *)&local_490,(string *)&local_450,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err_00);
LAB_0029d288:
      poVar4 = ::std::operator<<((ostream *)&local_2a8,(string *)&local_430);
      ::std::operator<<(poVar4,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)&local_4a0->_err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2a8);
  }
  bVar2 = false;
LAB_0029d546:
  Path::~Path(&local_378);
  ::std::__cxx11::string::_M_dispose();
  RenderMaterial::~RenderMaterial((RenderMaterial *)local_130);
  return bVar2;
}

Assistant:

bool RenderSceneConverter::ConvertMaterial(const RenderSceneConverterEnv &env,
                                           const Path &mat_abs_path,
                                           const tinyusdz::Material &material,
                                           RenderMaterial *rmat_out) {
  if (!rmat_out) {
    PUSH_ERROR_AND_RETURN("rmat_out argument is nullptr.");
  }

  RenderMaterial rmat;
  rmat.abs_path = mat_abs_path.prim_part();
  rmat.name = mat_abs_path.element_name();
  DCOUT("rmat.abs_path = " << rmat.abs_path);
  DCOUT("rmat.name = " << rmat.name);
  std::string err;
  Path surfacePath;

  //
  // surface shader
  {
    if (material.surface.authored()) {
      auto paths = material.surface.get_connections();
      DCOUT("paths = " << paths);
      // must have single targetPath.
      if (paths.size() != 1) {
        PUSH_ERROR_AND_RETURN(
            fmt::format("{}'s outputs:surface must be connection with single "
                        "target Path.\n",
                        mat_abs_path.full_path_name()));
      }
      surfacePath = paths[0];
    } else {
      // May be PhysicsMaterial?
      // Create dummy material

      PUSH_WARN(fmt::format("{}'s outputs:surface isn't authored, so not a valid Material/Shader. Create a default Material\n",
                      mat_abs_path.full_path_name()));


      (*rmat_out) = rmat;
      return true;

      PUSH_ERROR_AND_RETURN(
          fmt::format("{}'s outputs:surface isn't authored.\n",
                      mat_abs_path.full_path_name()));
    }

    const Prim *shaderPrim{nullptr};
    if (!env.stage.find_prim_at_path(
            Path(surfacePath.prim_part(), /* prop part */ ""), shaderPrim,
            &err)) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "{}'s outputs:surface isn't connected to exising Prim path.\n",
          mat_abs_path.full_path_name()));
    }

    if (!shaderPrim) {
      // this should not happen though.
      PUSH_ERROR_AND_RETURN("[InternalError] invalid Shader Prim.\n");
    }

    const Shader *shader = shaderPrim->as<Shader>();

    if (!shader) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("{}'s outputs:surface must be connected to Shader Prim, "
                      "but connected to `{}` Prim.\n",
                      shaderPrim->prim_type_name()));
    }

    // Currently must be UsdPreviewSurface
    const UsdPreviewSurface *psurface = shader->value.as<UsdPreviewSurface>();
    if (!psurface) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Shader's info:id must be UsdPreviewSurface, but got {}",
                      shader->info_id));
    }

    // prop part must be `outputs:surface` for now.
    if (surfacePath.prop_part() != "outputs:surface") {
      PUSH_ERROR_AND_RETURN(
          fmt::format("{}'s outputs:surface connection must point to property "
                      "`outputs:surface`, but got `{}`",
                      mat_abs_path.full_path_name(), surfacePath.prop_part()));
    }

    PreviewSurfaceShader pss;
    if (!ConvertPreviewSurfaceShader(env, surfacePath, *psurface, &pss)) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "Failed to convert UsdPreviewSurface : {}", surfacePath.prim_part()));
    }

    rmat.surfaceShader = pss;
  }

  DCOUT("Converted Material: " << mat_abs_path);

  (*rmat_out) = rmat;
  return true;
}